

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O1

void __thiscall
cppnet::Dispatcher::Connect::anon_class_48_3_02cd77fa::operator()(anon_class_48_3_02cd77fa *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  Dispatcher *pDVar3;
  long *plVar4;
  int iVar5;
  element_type *peVar6;
  bool bVar7;
  shared_ptr<cppnet::RWSocket> sock;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  long *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  element_type *local_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  long local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  pDVar3 = this->this;
  MakeRWSocket();
  plVar4 = local_50;
  std::__shared_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppnet::Dispatcher,void>
            ((__shared_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (__weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2> *)
             &pDVar3->super_enable_shared_from_this<cppnet::Dispatcher>);
  plVar4[0xc] = local_30;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(plVar4 + 0xd),&local_28);
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  local_40 = (pDVar3->_event_actions).
             super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38._M_pi =
       (pDVar3->_event_actions).super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_weak_count = (local_38._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_weak_count = (local_38._M_pi)->_M_weak_count + 1;
    }
  }
  local_50[10] = (long)local_40;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0xb),&local_38);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_38._M_pi)->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = (local_38._M_pi)->_M_weak_count;
      (local_38._M_pi)->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*(local_38._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  local_58._M_pi =
       (pDVar3->_cppnet_base).super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar5 = (local_58._M_pi)->_M_use_count;
    do {
      if (iVar5 == 0) {
        local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar2 = (local_58._M_pi)->_M_use_count;
      bVar7 = iVar5 == iVar2;
      if (bVar7) {
        (local_58._M_pi)->_M_use_count = iVar5 + 1;
        iVar2 = iVar5;
      }
      iVar5 = iVar2;
      UNLOCK();
    } while (!bVar7);
  }
  if (local_58._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar7 = true;
  }
  else {
    bVar7 = (local_58._M_pi)->_M_use_count == 0;
  }
  if (bVar7) {
    peVar6 = (element_type *)0x0;
  }
  else {
    peVar6 = (pDVar3->_cppnet_base).super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  }
  local_50[8] = (long)peVar6;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 9),&local_58);
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  (**(code **)(*local_50 + 0x48))(local_50,this,this->port);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

void Dispatcher::Connect(const std::string& ip, uint16_t port) {
    auto task = [ip, port, this]() {
        auto sock = MakeRWSocket();
        sock->SetDispatcher(shared_from_this());
        sock->SetEventActions(_event_actions);
        sock->SetCppNetBase(_cppnet_base.lock());
        sock->Connect(ip, port);
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}